

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O2

char * igets(void)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  
  pcVar1 = PatchPt;
  cVar2 = *PatchPt;
  if ((cVar2 != '\0') && (PatchPt < PatchFile + PatchSize)) {
    while( true ) {
      pcVar3 = PatchPt + 1;
      if (cVar2 == '\0') {
        return pcVar1;
      }
      if (cVar2 == '\n') break;
      cVar2 = *pcVar3;
      PatchPt = pcVar3;
    }
    *PatchPt = '\0';
    PatchPt = pcVar3;
    return pcVar1;
  }
  return (char *)0x0;
}

Assistant:

static char *igets (void)
{
	char *line;

	if (*PatchPt == '\0' || PatchPt >= PatchFile + PatchSize )
		return NULL;

	line = PatchPt;

	while (*PatchPt != '\n' && *PatchPt != '\0')
		PatchPt++;

	if (*PatchPt == '\n')
		*PatchPt++ = 0;

	return line;
}